

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::CopyAELToSEL(Clipper *this)

{
  TEdge *pTVar1;
  TEdge **ppTVar2;
  
  pTVar1 = this->m_ActiveEdges;
  this->m_SortedEdges = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    ppTVar2 = &pTVar1->prevInSEL;
    while( true ) {
      *ppTVar2 = (TEdge *)0x0;
      pTVar1 = pTVar1->nextInAEL;
      if (pTVar1 == (TEdge *)0x0) break;
      pTVar1->prevInSEL = pTVar1->prevInAEL;
      pTVar1->prevInAEL->nextInSEL = pTVar1;
      ppTVar2 = &pTVar1->nextInSEL;
    }
  }
  return;
}

Assistant:

void Clipper::CopyAELToSEL()
{
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  if (!m_ActiveEdges) return;
  m_SortedEdges->prevInSEL = 0;
  e = e->nextInAEL;
  while ( e )
  {
    e->prevInSEL = e->prevInAEL;
    e->prevInSEL->nextInSEL = e;
    e->nextInSEL = 0;
    e = e->nextInAEL;
  }
}